

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void incrAggFunctionDepth(Expr *pExpr,int N)

{
  undefined1 local_48 [8];
  Walker w;
  int N_local;
  Expr *pExpr_local;
  
  if (0 < N) {
    w.u._4_4_ = N;
    memset(local_48,0,0x30);
    w.pParse = (Parse *)incrAggDepth;
    w.walkerDepth = w.u._4_4_;
    sqlite3WalkExpr((Walker *)local_48,pExpr);
  }
  return;
}

Assistant:

static void incrAggFunctionDepth(Expr *pExpr, int N){
  if( N>0 ){
    Walker w;
    memset(&w, 0, sizeof(w));
    w.xExprCallback = incrAggDepth;
    w.u.n = N;
    sqlite3WalkExpr(&w, pExpr);
  }
}